

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Cec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Cex_t *pAVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Gia_Man_t *pGVar7;
  FILE *__stream;
  Gia_Man_t *pInit;
  char *pcVar8;
  char *pcVar9;
  Cec_ParCec_t ParsCec;
  
  Cec_ManCecSetDefaultParams(&ParsCec);
  bVar2 = false;
  Extra_UtilGetoptReset();
  bVar3 = false;
  bVar4 = false;
LAB_0021a46e:
  do {
    iVar5 = Extra_UtilGetopt(argc,argv,"CTnmdasvh");
    iVar6 = globalUtilOptind;
    switch(iVar5) {
    case 0x6d:
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_0021a46e;
    case 0x6e:
      ParsCec.fNaive = ParsCec.fNaive ^ 1;
      goto LAB_0021a46e;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
      goto switchD_0021a4a5_caseD_6f;
    case 0x73:
      ParsCec.fSilent = ParsCec.fSilent ^ 1;
      goto LAB_0021a46e;
    case 0x76:
      ParsCec.fVerbose = ParsCec.fVerbose ^ 1;
      goto LAB_0021a46e;
    }
    if (iVar5 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0021a5a3:
        Abc_Print(-1,pcVar8);
        goto switchD_0021a4a5_caseD_6f;
      }
      iVar5 = atoi(argv[globalUtilOptind]);
      ParsCec.nBTLimit = iVar5;
    }
    else {
      if (iVar5 != 0x54) {
        if (iVar5 == 0x61) {
          bVar4 = (bool)(bVar4 ^ 1);
        }
        else {
          if (iVar5 != 100) {
            if (iVar5 == -1) {
              pGVar7 = pAbc->pGia;
              if (pGVar7 == (Gia_Man_t *)0x0) {
                pcVar8 = "Abc_CommandAbc9Cec(): There is no AIG.\n";
              }
              else if (bVar2) {
                if (!bVar3) {
                  if (ParsCec.fSilent == 0) {
                    Abc_Print(1,
                              "Assuming the current network is a single-output miter. (Conflict limit = %d.)\n"
                              ,(ulong)(uint)ParsCec.nBTLimit);
                    pGVar7 = pAbc->pGia;
                  }
                  pGVar7 = Gia_ManDemiterToDual(pGVar7);
                  iVar6 = Cec_ManVerify(pGVar7,&ParsCec);
                  pAbc->Status = iVar6;
                  pAVar1 = pAbc->pGia->pCexComb;
                  pAbc->pGia->pCexComb = pGVar7->pCexComb;
                  pGVar7->pCexComb = pAVar1;
                  Gia_ManStop(pGVar7);
LAB_0021a76d:
                  Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexComb);
                  return 0;
                }
                if ((pGVar7->vCos->nSize - pGVar7->nRegs & 1U) == 0) {
                  if (ParsCec.fSilent == 0) {
                    Abc_Print(1,
                              "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n"
                              ,(ulong)(uint)ParsCec.nBTLimit);
                    pGVar7 = pAbc->pGia;
                  }
                  iVar6 = Cec_ManVerify(pGVar7,&ParsCec);
                  pAbc->Status = iVar6;
                  goto LAB_0021a76d;
                }
                pcVar8 = "The dual-output miter should have an even number of outputs.\n";
              }
              else {
                if (argc - globalUtilOptind == 1) {
                  pcVar8 = argv[globalUtilOptind];
                  pcVar9 = pcVar8;
LAB_0021a7a5:
                  do {
                    if (*pcVar8 == '>') {
                      *pcVar8 = '\\';
                    }
                    else if (*pcVar8 == '\0') {
                      __stream = fopen(pcVar9,"r");
                      if (__stream == (FILE *)0x0) {
                        Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar9);
                        pcVar8 = Extra_FileGetSimilarName
                                           (pcVar9,".aig",(char *)0x0,(char *)0x0,(char *)0x0,
                                            (char *)0x0);
                        if (pcVar8 != (char *)0x0) {
                          Abc_Print(1,"Did you mean \"%s\"?",pcVar8);
                        }
                        pcVar8 = "\n";
                        iVar6 = 1;
                        iVar5 = iVar6;
                      }
                      else {
                        fclose(__stream);
                        pGVar7 = Gia_AigerRead(pcVar9,0,0,0);
                        if (pGVar7 != (Gia_Man_t *)0x0) {
                          pInit = Gia_ManMiter(pAbc->pGia,pGVar7,0,1,0,0,ParsCec.fVerbose);
                          if (pInit != (Gia_Man_t *)0x0) {
                            if (bVar4) {
                              Abc_Print(0,"The verification miter is written into file \"%s\".\n",
                                        "cec_miter.aig");
                              Gia_AigerWrite(pInit,"cec_miter.aig",0,0);
                            }
                            iVar6 = Cec_ManVerify(pInit,&ParsCec);
                            pAbc->Status = iVar6;
                            Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexComb);
                            Gia_ManStop(pInit);
                          }
                          Gia_ManStop(pGVar7);
                          return 0;
                        }
                        pcVar8 = "Reading AIGER has failed.\n";
                        iVar6 = -1;
                        iVar5 = 0;
                      }
                      Abc_Print(iVar6,pcVar8);
                      return iVar5;
                    }
                    pcVar8 = pcVar8 + 1;
                  } while( true );
                }
                pcVar8 = pGVar7->pSpec;
                pcVar9 = pcVar8;
                if (pcVar8 != (char *)0x0) goto LAB_0021a7a5;
                pcVar8 = "File name is not given on the command line.\n";
              }
              iVar6 = -1;
              goto LAB_0021a6c2;
            }
            goto switchD_0021a4a5_caseD_6f;
          }
          bVar3 = (bool)(bVar3 ^ 1);
        }
        goto LAB_0021a46e;
      }
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_0021a5a3;
      }
      iVar5 = atoi(argv[globalUtilOptind]);
      ParsCec.TimeLimit = iVar5;
    }
    globalUtilOptind = iVar6 + 1;
    if (iVar5 < 0) {
switchD_0021a4a5_caseD_6f:
      iVar6 = -2;
      Abc_Print(-2,"usage: &cec [-CT num] [-nmdasvh]\n");
      Abc_Print(-2,"\t         new combinational equivalence checker\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)ParsCec.nBTLimit);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)(uint)ParsCec.TimeLimit);
      pcVar9 = "yes";
      pcVar8 = "yes";
      if (ParsCec.fNaive == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-n     : toggle using naive SAT-based checking [default = %s]\n",pcVar8);
      pcVar8 = "miter";
      if (!bVar2) {
        pcVar8 = "two circuits";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. two circuits [default = %s]\n",pcVar8);
      pcVar8 = "yes";
      if (!bVar3) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle using dual output miter [default = %s]\n",pcVar8);
      pcVar8 = "yes";
      if (!bVar4) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle writing dual-output miter [default = %s]\n",pcVar8);
      pcVar8 = "yes";
      if (ParsCec.fSilent == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle silent operation [default = %s]\n",pcVar8);
      if (ParsCec.fVerbose == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar9);
      pcVar8 = "\t-h     : print the command usage\n";
LAB_0021a6c2:
      Abc_Print(iVar6,pcVar8);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Cec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParCec_t ParsCec, * pPars = &ParsCec;
    FILE * pFile;
    Gia_Man_t * pSecond, * pMiter;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int c, nArgcNew, fMiter = 0, fDualOutput = 0, fDumpMiter = 0;
    Cec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTnmdasvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'n':
            pPars->fNaive ^= 1;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'd':
            fDualOutput ^= 1;
            break;
        case 'a':
            fDumpMiter ^= 1;
            break;
        case 's':
            pPars->fSilent ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cec(): There is no AIG.\n" );
        return 1;
    }
    if ( fMiter )
    {
        if ( fDualOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            pAbc->Status = Cec_ManVerify( pAbc->pGia, pPars );
        }
        else
        {
            Gia_Man_t * pTemp;
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a single-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            pTemp = Gia_ManDemiterToDual( pAbc->pGia );
            pAbc->Status = Cec_ManVerify( pTemp, pPars );
            ABC_SWAP( Abc_Cex_t *, pAbc->pGia->pCexComb, pTemp->pCexComb );
            Gia_ManStop( pTemp );
        }        
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        return 0;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        if ( pAbc->pGia->pSpec == NULL )
        {
            Abc_Print( -1, "File name is not given on the command line.\n" );
            return 1;
        }
        FileName = pAbc->pGia->pSpec;
    }
    else
        FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    pSecond = Gia_AigerRead( FileName, 0, 0, 0 );
    if ( pSecond == NULL )
    {
        Abc_Print( -1, "Reading AIGER has failed.\n" );
        return 0;
    }
    // compute the miter
    pMiter = Gia_ManMiter( pAbc->pGia, pSecond, 0, 1, 0, 0, pPars->fVerbose );
    if ( pMiter )
    {
        if ( fDumpMiter )
        {
            Abc_Print( 0, "The verification miter is written into file \"%s\".\n", "cec_miter.aig" );
            Gia_AigerWrite( pMiter, "cec_miter.aig", 0, 0 );
        }
        pAbc->Status = Cec_ManVerify( pMiter, pPars );
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        Gia_ManStop( pMiter );
    }
    Gia_ManStop( pSecond );
    return 0;

usage:
    Abc_Print( -2, "usage: &cec [-CT num] [-nmdasvh]\n" );
    Abc_Print( -2, "\t         new combinational equivalence checker\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-n     : toggle using naive SAT-based checking [default = %s]\n", pPars->fNaive? "yes":"no");
    Abc_Print( -2, "\t-m     : toggle miter vs. two circuits [default = %s]\n", fMiter? "miter":"two circuits");
    Abc_Print( -2, "\t-d     : toggle using dual output miter [default = %s]\n", fDualOutput? "yes":"no");
    Abc_Print( -2, "\t-a     : toggle writing dual-output miter [default = %s]\n", fDumpMiter? "yes":"no");
    Abc_Print( -2, "\t-s     : toggle silent operation [default = %s]\n", pPars->fSilent ? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}